

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

void Dar_BalanceCone_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  uint __line;
  Aig_Obj_t *pObj_00;
  char *__assertion;
  
  while( true ) {
    if (pObj == pRoot) {
      if (((ulong)pObj & 1) != 0) {
        __assertion = "!Aig_IsComplement(pObj)";
        __line = 0x70;
        goto LAB_0041f1ca;
      }
    }
    else if (((((ulong)pObj & 1) != 0) ||
             ((*(ulong *)&pObj->field_0x18 & 0xffffff80) != 0 ||
              ((*(uint *)&pRoot->field_0x18 ^ (uint)*(ulong *)&pObj->field_0x18) & 7) != 0)) ||
            (10000 < vSuper->nSize)) {
      Vec_PtrPush(vSuper,pObj);
      return;
    }
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) break;
    pObj_00 = Aig_ObjReal_rec(pObj->pFanin0);
    Dar_BalanceCone_rec(pRoot,pObj_00,vSuper);
    pObj = Aig_ObjReal_rec(pObj->pFanin1);
  }
  __assertion = "Aig_ObjIsNode(pObj)";
  __line = 0x71;
LAB_0041f1ca:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                ,__line,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Dar_BalanceCone_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pObj != pRoot && (Aig_IsComplement(pObj) || Aig_ObjType(pObj) != Aig_ObjType(pRoot) || Aig_ObjRefs(pObj) > 1 || Vec_PtrSize(vSuper) > 10000) )
        Vec_PtrPush( vSuper, pObj );
    else
    {
        assert( !Aig_IsComplement(pObj) );
        assert( Aig_ObjIsNode(pObj) );
        // go through the branches
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild0(pObj) ), vSuper );
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild1(pObj) ), vSuper );
    }
}